

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

_Bool ecdsa_verify_msg_as_qelem
                (uint64_t *m_q,uint8_t *public_key,uint8_t *signature_r,uint8_t *signature_s)

{
  _Bool _Var1;
  uint64_t *res_00;
  uint64_t *res_01;
  uint64_t uVar2;
  uint64_t uVar3;
  _Bool res1;
  uint64_t x [4];
  uint64_t res [12];
  uint64_t sinv [4];
  _Bool is_rs_valid;
  uint64_t is_s_valid;
  uint64_t is_r_valid;
  _Bool is_pk_valid;
  uint64_t *u2;
  uint64_t *u1;
  uint64_t *s_q;
  uint64_t *r_q;
  uint64_t *pk;
  uint64_t tmp [28];
  uint8_t *signature_s_local;
  uint8_t *signature_r_local;
  uint8_t *public_key_local;
  uint64_t *m_q_local;
  
  memset(&pk,0,0xe0);
  res_00 = tmp + 0xb;
  res_01 = tmp + 0xf;
  _Var1 = load_point_vartime((uint64_t *)&pk,public_key);
  bn_from_bytes_be4(res_00,signature_r);
  bn_from_bytes_be4(res_01,signature_s);
  uVar2 = bn_is_lt_order_and_gt_zero_mask4(res_00);
  uVar3 = bn_is_lt_order_and_gt_zero_mask4(res_01);
  if ((_Var1) && (uVar2 == 0xffffffffffffffff && uVar3 == 0xffffffffffffffff)) {
    memset(res + 0xb,0,0x20);
    qinv(res + 0xb,res_01);
    qmul_mont(res + 0xb,m_q,tmp + 0x13);
    qmul_mont(res + 0xb,res_00,tmp + 0x17);
    memset(x + 3,0,0x60);
    point_mul_double_g(x + 3,tmp + 0x13,tmp + 0x17,(uint64_t *)&pk);
    _Var1 = is_point_at_inf_vartime(x + 3);
    if (_Var1) {
      m_q_local._7_1_ = false;
    }
    else {
      memset(&stack0xfffffffffffffdf8,0,0x20);
      to_aff_point_x((uint64_t *)&stack0xfffffffffffffdf8,x + 3);
      qmod_short((uint64_t *)&stack0xfffffffffffffdf8,(uint64_t *)&stack0xfffffffffffffdf8);
      m_q_local._7_1_ = bn_is_eq_vartime4((uint64_t *)&stack0xfffffffffffffdf8,res_00);
    }
  }
  else {
    m_q_local._7_1_ = false;
  }
  return m_q_local._7_1_;
}

Assistant:

static inline bool
ecdsa_verify_msg_as_qelem(
  uint64_t *m_q,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t tmp[28U] = { 0U };
  uint64_t *pk = tmp;
  uint64_t *r_q = tmp + 12U;
  uint64_t *s_q = tmp + 16U;
  uint64_t *u1 = tmp + 20U;
  uint64_t *u2 = tmp + 24U;
  bool is_pk_valid = load_point_vartime(pk, public_key);
  bn_from_bytes_be4(r_q, signature_r);
  bn_from_bytes_be4(s_q, signature_s);
  uint64_t is_r_valid = bn_is_lt_order_and_gt_zero_mask4(r_q);
  uint64_t is_s_valid = bn_is_lt_order_and_gt_zero_mask4(s_q);
  bool is_rs_valid = is_r_valid == 0xFFFFFFFFFFFFFFFFULL && is_s_valid == 0xFFFFFFFFFFFFFFFFULL;
  if (!(is_pk_valid && is_rs_valid))
  {
    return false;
  }
  uint64_t sinv[4U] = { 0U };
  qinv(sinv, s_q);
  qmul_mont(sinv, m_q, u1);
  qmul_mont(sinv, r_q, u2);
  uint64_t res[12U] = { 0U };
  point_mul_double_g(res, u1, u2, pk);
  if (is_point_at_inf_vartime(res))
  {
    return false;
  }
  uint64_t x[4U] = { 0U };
  to_aff_point_x(x, res);
  qmod_short(x, x);
  bool res1 = bn_is_eq_vartime4(x, r_q);
  return res1;
}